

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::ForwardCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  stack_array<double,_16> *psVar1;
  int iVar2;
  transform_info *ptVar3;
  char *__function;
  ulong uVar4;
  grid *pgVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [64];
  grid_iterator<signed_char> ItEnd;
  grid_iterator<signed_char> It;
  grid_iterator<double> local_a0;
  grid_iterator<double> local_68;
  
  pgVar5 = (TransformDetails->StackGrids).Arr;
  for (uVar4 = 0; uVar4 != (uint)TransformDetails->StackSize; uVar4 = uVar4 + 1) {
    if (uVar4 == 0x20) {
      __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
      goto LAB_00180a99;
    }
    if (Vol->Type < __Invalid__) {
      iVar2 = (TransformDetails->StackAxes).Arr[uVar4];
      switch(Vol->Type) {
      case int8:
        if (iVar2 == 2) {
          FLiftCdf53Z<signed_char>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<signed_char>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<signed_char>(pgVar5,M3,Normal,Vol);
        }
        break;
      case uint8:
        if (iVar2 == 2) {
          FLiftCdf53Z<unsigned_char>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<unsigned_char>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<unsigned_char>(pgVar5,M3,Normal,Vol);
        }
        break;
      case int16:
        if (iVar2 == 2) {
          FLiftCdf53Z<short>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<short>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<short>(pgVar5,M3,Normal,Vol);
        }
        break;
      case uint16:
        if (iVar2 == 2) {
          FLiftCdf53Z<unsigned_short>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<unsigned_short>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<unsigned_short>(pgVar5,M3,Normal,Vol);
        }
        break;
      case int32:
        if (iVar2 == 2) {
          FLiftCdf53Z<int>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<int>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<int>(pgVar5,M3,Normal,Vol);
        }
        break;
      case uint32:
        if (iVar2 == 2) {
          FLiftCdf53Z<unsigned_int>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<unsigned_int>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<unsigned_int>(pgVar5,M3,Normal,Vol);
        }
        break;
      case int64:
        if (iVar2 == 2) {
          FLiftCdf53Z<long>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<long>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<long>(pgVar5,M3,Normal,Vol);
        }
        break;
      case uint64:
        if (iVar2 == 2) {
          FLiftCdf53Z<unsigned_long>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<unsigned_long>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<unsigned_long>(pgVar5,M3,Normal,Vol);
        }
        break;
      case float32:
        if (iVar2 == 2) {
          FLiftCdf53Z<float>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<float>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<float>(pgVar5,M3,Normal,Vol);
        }
        break;
      case float64:
        if (iVar2 == 2) {
          FLiftCdf53Z<double>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 1) {
          FLiftCdf53Y<double>(pgVar5,M3,Normal,Vol);
        }
        else if (iVar2 == 0) {
          FLiftCdf53X<double>(pgVar5,M3,Normal,Vol);
        }
      }
    }
    pgVar5 = pgVar5 + 1;
  }
  psVar1 = &(TransformDetails->BasisNorms).WaveNorms;
  lVar6 = 0;
  auVar11 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  do {
    if (Subbands->Size <= lVar6) {
      return;
    }
    if (lVar6 != 0 || CoarsestLevel) {
      dVar10 = auVar11._0_8_;
      pgVar5 = (grid *)((Subbands->Buffer).Data + lVar6 * 0x40);
      dVar7 = dVar10;
      if ((M3->field_0).field_0.X != 1) {
        iVar2 = (int)*(char *)((long)&pgVar5[2].super_extent.From + 3) +
                TransformDetails->NPasses * Iter;
        if (*(char *)((long)&pgVar5[2].super_extent.From + 6) == '\0') {
          if (0x10 < iVar2) goto LAB_00180a84;
          iVar2 = iVar2 + -1;
          ptVar3 = TransformDetails;
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (0xf < iVar2) goto LAB_00180a84;
        }
        dVar7 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
      }
      dVar9 = dVar10;
      if ((M3->field_0).field_0.Y != 1) {
        iVar2 = (int)*(char *)((long)&pgVar5[2].super_extent.From + 4) +
                TransformDetails->NPasses * Iter;
        if (*(char *)((long)&pgVar5[2].super_extent.From + 7) == '\0') {
          if (0x10 < iVar2) goto LAB_00180a84;
          iVar2 = iVar2 + -1;
          ptVar3 = TransformDetails;
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (0xf < iVar2) goto LAB_00180a84;
        }
        dVar9 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
      }
      if ((M3->field_0).field_0.Z != 1) {
        iVar2 = (int)*(char *)((long)&pgVar5[2].super_extent.From + 5) +
                TransformDetails->NPasses * Iter;
        if ((char)pgVar5[2].super_extent.Dims == '\0') {
          if (0x10 < iVar2) goto LAB_00180a84;
          iVar2 = iVar2 + -1;
          ptVar3 = TransformDetails;
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (0xf < iVar2) {
LAB_00180a84:
            __function = 
            "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
LAB_00180a99:
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,__function);
          }
        }
        dVar10 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
      }
      if (Vol->Type < __Invalid__) {
        dVar10 = dVar7 * dVar9 * dVar10;
        switch(Vol->Type) {
        case int8:
          End<signed_char>((grid_iterator<signed_char> *)&local_a0,pgVar5,Vol);
          Begin<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(char *)local_68.Ptr = (char)(int)((double)(int)*(char *)local_68.Ptr * dVar10);
            grid_iterator<signed_char>::operator++((grid_iterator<signed_char> *)&local_68);
          }
          break;
        case uint8:
          End<unsigned_char>((grid_iterator<unsigned_char> *)&local_a0,pgVar5,Vol);
          Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(char *)local_68.Ptr = (char)(int)((double)*(byte *)local_68.Ptr * dVar10);
            grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&local_68);
          }
          break;
        case int16:
          End<short>((grid_iterator<short> *)&local_a0,pgVar5,Vol);
          Begin<short>((grid_iterator<short> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(short *)local_68.Ptr = (short)(int)((double)(int)*(short *)local_68.Ptr * dVar10);
            grid_iterator<short>::operator++((grid_iterator<short> *)&local_68);
          }
          break;
        case uint16:
          End<unsigned_short>((grid_iterator<unsigned_short> *)&local_a0,pgVar5,Vol);
          Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(short *)local_68.Ptr = (short)(int)((double)*(ushort *)local_68.Ptr * dVar10);
            grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&local_68);
          }
          break;
        case int32:
          End<int>((grid_iterator<int> *)&local_a0,pgVar5,Vol);
          Begin<int>((grid_iterator<int> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(int *)local_68.Ptr = (int)((double)(int)*(float *)local_68.Ptr * dVar10);
            grid_iterator<int>::operator++((grid_iterator<int> *)&local_68);
          }
          break;
        case uint32:
          End<unsigned_int>((grid_iterator<unsigned_int> *)&local_a0,pgVar5,Vol);
          Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(float *)local_68.Ptr = (float)(long)((double)(uint)*(float *)local_68.Ptr * dVar10);
            grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&local_68);
          }
          break;
        case int64:
          End<long>((grid_iterator<long> *)&local_a0,pgVar5,Vol);
          Begin<long>((grid_iterator<long> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *local_68.Ptr = (double)(long)((double)(long)*local_68.Ptr * dVar10);
            grid_iterator<long>::operator++((grid_iterator<long> *)&local_68);
          }
          break;
        case uint64:
          End<unsigned_long>((grid_iterator<unsigned_long> *)&local_a0,pgVar5,Vol);
          Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *local_68.Ptr;
            auVar8 = vunpcklps_avx(auVar8,_DAT_00199c70);
            auVar8 = vsubpd_avx(auVar8,_DAT_00199c80);
            dVar7 = (auVar8._0_8_ + auVar8._8_8_) * dVar10;
            uVar4 = (ulong)dVar7;
            *local_68.Ptr =
                 (double)((long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
            grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&local_68);
          }
          break;
        case float32:
          End<float>((grid_iterator<float> *)&local_a0,pgVar5,Vol);
          Begin<float>((grid_iterator<float> *)&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(float *)local_68.Ptr = (float)((double)*(float *)local_68.Ptr * dVar10);
            grid_iterator<float>::operator++((grid_iterator<float> *)&local_68);
          }
          break;
        case float64:
          End<double>(&local_a0,pgVar5,Vol);
          Begin<double>(&local_68,pgVar5,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *local_68.Ptr = dVar10 * *local_68.Ptr;
            grid_iterator<double>::operator++(&local_68);
          }
        }
        auVar11 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void
ForwardCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  idx2_For (int, I, 0, TransformDetails.StackSize)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      FLiftCdf53X<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 1:                                                                                        \
      FLiftCdf53Y<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 2:                                                                                        \
      FLiftCdf53Z<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* Optionally normalize */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}